

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getSubwords
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Dictionary *this,string *word)

{
  bool bVar1;
  int32_t i;
  vector<int,_std::allocator<int>_> *__x;
  string_view w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  w._M_str = (word->_M_dataplus)._M_p;
  w._M_len = word->_M_string_length;
  i = getId(this,w);
  if (i < 0) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar1 = std::operator!=(word,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&EOS_abi_cxx11_);
    if (bVar1) {
      std::operator+(&bStack_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     BOW_abi_cxx11_,word);
      std::operator+(&local_38,&bStack_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     EOW_abi_cxx11_);
      computeSubwords(this,&local_38,__return_storage_ptr__,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&bStack_58);
    }
  }
  else {
    __x = getSubwords(this,i);
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<int32_t> Dictionary::getSubwords(
    const std::string& word) const {
  int32_t i = getId(word);
  if (i >= 0) {
    return getSubwords(i);
  }
  std::vector<int32_t> ngrams;
  if (word != EOS) {
    computeSubwords(BOW + word + EOW, ngrams);
  }
  return ngrams;
}